

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ellipse.cpp
# Opt level: O0

bool __thiscall ON_Ellipse::Create(ON_Ellipse *this,ON_Plane *p,double rx,double ry)

{
  bool bVar1;
  double ry_local;
  double rx_local;
  ON_Plane *p_local;
  ON_Ellipse *this_local;
  
  memcpy(this,p,0x80);
  this->radius[0] = rx;
  this->radius[1] = ry;
  bVar1 = IsValid(this);
  return bVar1;
}

Assistant:

bool ON_Ellipse::Create( const ON_Plane& p, double rx, double ry )
{
  plane = p;
  radius[0] = rx;
  radius[1] = ry;
  return IsValid();
}